

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O1

DebugMLTSampler * __thiscall
pbrt::DebugMLTSampler::Create
          (DebugMLTSampler *__return_storage_ptr__,DebugMLTSampler *this,
          span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          state,int nSampleStreams)

{
  undefined8 uVar1;
  bool bVar2;
  memory_resource *pmVar3;
  float *ptr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__new_size;
  long lVar4;
  undefined1 auVar5 [16];
  string_view str;
  
  ptr = (float *)state.n;
  __new_size = state.ptr;
  (__return_storage_ptr__->super_MLTSampler).mutationsPerPixel = 1;
  (__return_storage_ptr__->super_MLTSampler).rng.inc = 1;
  (__return_storage_ptr__->super_MLTSampler).rng.state = 0x5851f42d4c957f2e;
  auVar5._8_4_ = 0x3f000000;
  auVar5._0_8_ = 0x3f0000003f000000;
  auVar5._12_4_ = 0x3f000000;
  uVar1 = vmovlps_avx(auVar5);
  (__return_storage_ptr__->super_MLTSampler).sigma = (Float)(int)uVar1;
  (__return_storage_ptr__->super_MLTSampler).largeStepProbability =
       (Float)(int)((ulong)uVar1 >> 0x20);
  (__return_storage_ptr__->super_MLTSampler).streamCount = (int)state.n;
  pmVar3 = pstd::pmr::new_delete_resource();
  (__return_storage_ptr__->super_MLTSampler).X.alloc.memoryResource = pmVar3;
  (__return_storage_ptr__->super_MLTSampler).X.ptr = (PrimarySample *)0x0;
  (__return_storage_ptr__->super_MLTSampler).X.nAlloc = 0;
  (__return_storage_ptr__->super_MLTSampler).X.nStored = 0;
  (__return_storage_ptr__->super_MLTSampler).currentIteration = 0;
  (__return_storage_ptr__->super_MLTSampler).largeStep = true;
  (__return_storage_ptr__->super_MLTSampler).lastLargeStepIteration = 0;
  (__return_storage_ptr__->u).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)SUB168(ZEXT416(0) << 0x40,0);
  (__return_storage_ptr__->u).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)SUB168(ZEXT416(0) << 0x40,8);
  (__return_storage_ptr__->u).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<float,_std::allocator<float>_>::resize
            (&__return_storage_ptr__->u,(size_type)__new_size);
  if (__new_size != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    lVar4 = 0;
    do {
      str._M_str = (char *)((long)(__return_storage_ptr__->u).
                                  super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                  super__Vector_impl_data._M_start + lVar4);
      str._M_len = *(size_t *)&this->super_MLTSampler;
      bVar2 = Atof((pbrt *)(this->super_MLTSampler).rng.state,str,ptr);
      if (!bVar2) {
        ErrorExit<std::__cxx11::string_const&>
                  ("Invalid value in --debugstate: %s",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
      }
      this = (DebugMLTSampler *)&(this->super_MLTSampler).streamCount;
      lVar4 = lVar4 + 4;
      __new_size = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&__new_size[-1].field_2 + 0xf);
    } while (__new_size != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    ;
  }
  return __return_storage_ptr__;
}

Assistant:

DebugMLTSampler DebugMLTSampler::Create(pstd::span<const std::string> state,
                                        int nSampleStreams) {
    DebugMLTSampler ds(nSampleStreams);
    ds.u.resize(state.size());
    for (size_t i = 0; i < state.size(); ++i) {
#ifdef PBRT_FLOAT_AS_DOUBLE
        if (!Atod(state[i], &ds.u[i]))
#else
        if (!Atof(state[i], &ds.u[i]))
#endif
            ErrorExit("Invalid value in --debugstate: %s", state[i]);
    }
    return ds;
}